

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall slang::SmallVector<int,_10UL>::SmallVector(SmallVector<int,_10UL> *this,Base *other)

{
  bool bVar1;
  move_iterator<int_*> last;
  move_iterator<int_*> this_00;
  int *piVar2;
  unsigned_long uVar3;
  move_iterator<int_*> in_RSI;
  SmallVectorBase<int> *in_RDI;
  void **in_stack_ffffffffffffff98;
  SmallVectorBase<int> *in_stack_ffffffffffffffa0;
  
  SmallVectorBase<int>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<int>::isSmall((SmallVectorBase<int> *)in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 10;
    SmallVectorBase<int>::begin((SmallVectorBase<int> *)in_RSI._M_current);
    last = std::make_move_iterator<int*>((int *)in_stack_ffffffffffffff98);
    SmallVectorBase<int>::end((SmallVectorBase<int> *)in_RSI._M_current);
    this_00 = std::make_move_iterator<int*>((int *)in_stack_ffffffffffffff98);
    SmallVectorBase<int>::append<std::move_iterator<int_*>_>
              ((SmallVectorBase<int> *)this_00._M_current,in_RSI,last);
    SmallVectorBase<int>::clear(in_stack_ffffffffffffffa0);
  }
  else {
    piVar2 = std::exchange<int*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,in_stack_ffffffffffffff98);
    in_RDI->data_ = piVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }